

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void check_conflict(LexState *ls,LHS_assign *lh,expdesc *v)

{
  byte bVar1;
  FuncState *fs_00;
  bool bVar2;
  OpCode o;
  OpCode op;
  int conflict;
  int extra;
  FuncState *fs;
  expdesc *v_local;
  LHS_assign *lh_local;
  LexState *ls_local;
  
  fs_00 = ls->fs;
  bVar1 = fs_00->freereg;
  bVar2 = false;
  for (v_local = (expdesc *)lh; v_local != (expdesc *)0x0; v_local = *(expdesc **)v_local) {
    if ((v_local->u).info == 10) {
      if (((uint)*(byte *)((long)&v_local->t + 3) == v->k) &&
         ((uint)*(byte *)((long)&v_local->t + 2) == (v->u).info)) {
        bVar2 = true;
        *(undefined1 *)((long)&v_local->t + 3) = 8;
        *(byte *)((long)&v_local->t + 2) = bVar1;
      }
      if ((v->k == VLOCAL) && ((int)(short)v_local->t == (v->u).info)) {
        bVar2 = true;
        *(ushort *)&v_local->t = (ushort)bVar1;
      }
    }
  }
  if (bVar2) {
    o = OP_GETUPVAL;
    if (v->k == VLOCAL) {
      o = OP_MOVE;
    }
    luaK_codeABC(fs_00,o,(uint)bVar1,(v->u).info,0);
    luaK_reserveregs(fs_00,1);
  }
  return;
}

Assistant:

static void check_conflict (LexState *ls, struct LHS_assign *lh, expdesc *v) {
  FuncState *fs = ls->fs;
  int extra = fs->freereg;  /* eventual position to save local variable */
  int conflict = 0;
  for (; lh; lh = lh->prev) {  /* check all previous assignments */
    if (lh->v.k == VINDEXED) {  /* assigning to a table? */
      /* table is the upvalue/local being assigned now? */
      if (lh->v.u.ind.vt == v->k && lh->v.u.ind.t == v->u.info) {
        conflict = 1;
        lh->v.u.ind.vt = VLOCAL;
        lh->v.u.ind.t = extra;  /* previous assignment will use safe copy */
      }
      /* index is the local being assigned? (index cannot be upvalue) */
      if (v->k == VLOCAL && lh->v.u.ind.idx == v->u.info) {
        conflict = 1;
        lh->v.u.ind.idx = extra;  /* previous assignment will use safe copy */
      }
    }
  }
  if (conflict) {
    /* copy upvalue/local value to a temporary (in position 'extra') */
    OpCode op = (v->k == VLOCAL) ? OP_MOVE : OP_GETUPVAL;
    luaK_codeABC(fs, op, extra, v->u.info, 0);
    luaK_reserveregs(fs, 1);
  }
}